

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  WhereTerm *pWVar1;
  int in_ESI;
  int *in_RDI;
  Expr *pX;
  int iTerm;
  CollSeq *pC;
  char *zRet;
  HiddenIndexInfo *pHidden;
  Parse *in_stack_ffffffffffffffb8;
  char *local_40;
  CollSeq *local_28;
  char *local_20;
  
  local_20 = (char *)0x0;
  if ((-1 < in_ESI) && (in_ESI < *in_RDI)) {
    local_28 = (CollSeq *)0x0;
    pWVar1 = termFromWhereClause(*(WhereClause **)(in_RDI + 0x18),
                                 *(int *)(*(long *)(in_RDI + 2) + (long)in_ESI * 0xc + 8));
    if (pWVar1->pExpr->pLeft != (Expr *)0x0) {
      local_28 = sqlite3ExprCompareCollSeq(in_stack_ffffffffffffffb8,(Expr *)0x148941);
    }
    if (local_28 == (CollSeq *)0x0) {
      local_40 = "BINARY";
    }
    else {
      local_40 = local_28->zName;
    }
    local_20 = local_40;
  }
  return local_20;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = termFromWhereClause(pHidden->pWC, iTerm)->pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}